

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O1

void __thiscall
duckdb::WindowDistinctAggregatorLocalState::FlushStates(WindowDistinctAggregatorLocalState *this)

{
  WindowDistinctAggregatorGlobalState *pWVar1;
  FunctionDataWrapper *pFVar2;
  AggregateInputData aggr_input_data;
  AggregateInputData local_38;
  
  if (this->flush_count != 0) {
    pWVar1 = this->gastate;
    if ((pWVar1->super_WindowAggregatorGlobalState).aggr.bind_data_wrapper.internal.
        super___shared_ptr<duckdb::FunctionDataWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      local_38.bind_data.ptr = (FunctionData *)0x0;
    }
    else {
      pFVar2 = shared_ptr<duckdb::FunctionDataWrapper,_true>::operator->
                         (&(pWVar1->super_WindowAggregatorGlobalState).aggr.bind_data_wrapper);
      local_38.bind_data.ptr =
           (pFVar2->function_data).
           super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>._M_t.
           super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>.
           _M_t.
           super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
           .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
    }
    local_38.allocator =
         &(this->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator;
    local_38.combine_type = PRESERVE_INPUT;
    Vector::Verify(&this->statel,this->flush_count);
    (*(pWVar1->super_WindowAggregatorGlobalState).aggr.function.combine)
              (&this->statel,&this->statep,&local_38,this->flush_count);
    this->flush_count = 0;
  }
  return;
}

Assistant:

void WindowDistinctAggregatorLocalState::FlushStates() {
	if (!flush_count) {
		return;
	}

	const auto &aggr = gastate.aggr;
	AggregateInputData aggr_input_data(aggr.GetFunctionData(), allocator);
	statel.Verify(flush_count);
	aggr.function.combine(statel, statep, aggr_input_data, flush_count);

	flush_count = 0;
}